

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O2

void __thiscall Sparse_matrix_Apply_to_vector(Sparse_matrix *this,double *vector,double *newVector)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar1 = this->size;
  uVar5 = 0;
  while (uVar6 = uVar5, uVar6 != uVar1) {
    pdVar3 = this->elements;
    dVar8 = pdVar3[uVar6] * vector[uVar6];
    newVector[uVar6] = dVar8;
    puVar4 = this->indices;
    uVar2 = puVar4[uVar6 + 1];
    for (uVar7 = (ulong)puVar4[uVar6]; uVar5 = uVar6 + 1, uVar7 < uVar2; uVar7 = uVar7 + 1) {
      dVar8 = dVar8 + pdVar3[uVar7] * vector[puVar4[uVar7]];
      newVector[uVar6] = dVar8;
    }
  }
  return;
}

Assistant:

void Sparse_matrix_Apply_to_vector (
    Sparse_matrix const * this,
    double const * vector,
    double * newVector) {

  register unsigned i, ind;
  
  for (i = 0; i < this->size; ++i) {
    newVector[i] = this->elements[i] * vector[i];
    for (ind = this->indices[i]; ind < this->indices[i+1]; ++ind) {
      newVector[i] += this->elements[ind] * vector[this->indices[ind]];
    }
  }
}